

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath.cpp
# Opt level: O2

void __thiscall QPainterPath::setFillRule(QPainterPath *this,FillRule fillRule)

{
  QPainterPathPrivate *pQVar1;
  
  ensureData(this);
  if (((((this->d_ptr).d.ptr)->field_0x84 & 0x20) == 0) == (fillRule == WindingFill)) {
    detach(this);
    pQVar1 = (this->d_ptr).d.ptr;
    pQVar1->field_0x84 = pQVar1->field_0x84 & 0xdf | (fillRule == WindingFill) << 5;
  }
  return;
}

Assistant:

void QPainterPath::setFillRule(Qt::FillRule fillRule)
{
    ensureData();
    const bool isWindingRequested = (fillRule == Qt::WindingFill);
    if (d_func()->hasWindingFill == isWindingRequested)
        return;
    detach();

    d_func()->hasWindingFill = isWindingRequested;
}